

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall
SQCompilation::CheckerVisitor::checkNewSlotNameMatch(CheckerVisitor *this,BinExpr *bin)

{
  TreeOp TVar1;
  BinExpr *in_RSI;
  long in_RDI;
  Expr *unaff_retaddr;
  Expr *rhs;
  Expr *lhs;
  
  if (((*(byte *)(in_RDI + 0x1d0) & 1) == 0) &&
     (TVar1 = Node::op((Node *)in_RSI), TVar1 == TO_NEWSLOT)) {
    BinExpr::lhs(in_RSI);
    BinExpr::rhs(in_RSI);
    checkKeyNameMismatch((CheckerVisitor *)lhs,rhs,unaff_retaddr);
  }
  return;
}

Assistant:

void CheckerVisitor::checkNewSlotNameMatch(const BinExpr *bin) {
  if (effectsOnly)
    return;

  if (bin->op() != TO_NEWSLOT)
    return;

  const Expr *lhs = bin->lhs();
  const Expr *rhs = bin->rhs();

  checkKeyNameMismatch(lhs, rhs);
}